

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O3

int readwbmp(_func_int_void_ptr *getin,void *in,Wbmp **return_wbmp)

{
  int iVar1;
  uint uVar2;
  Wbmp *ptr;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  ptr = (Wbmp *)gdMalloc(0x18);
  if (ptr != (Wbmp *)0x0) {
    iVar1 = (*getin)(in);
    ptr->type = iVar1;
    if (iVar1 == 0) {
      do {
        iVar1 = (*getin)(in);
        if (iVar1 < 0) goto LAB_00123a95;
      } while ((char)iVar1 < '\0');
      uVar6 = 0;
      do {
        uVar2 = (*getin)(in);
        if ((int)uVar2 < 0) {
          ptr->width = -1;
          goto LAB_00123a95;
        }
        uVar6 = uVar2 & 0x7f | uVar6 << 7;
      } while ((char)uVar2 < '\0');
      ptr->width = uVar6;
      if (uVar6 != 0xffffffff) {
        uVar6 = 0;
        do {
          uVar2 = (*getin)(in);
          if ((int)uVar2 < 0) {
            ptr->height = -1;
            goto LAB_00123a95;
          }
          uVar6 = uVar2 & 0x7f | uVar6 << 7;
        } while ((char)uVar2 < '\0');
        ptr->height = uVar6;
        if (((uVar6 != 0xffffffff) && (iVar1 = overflow2(4,ptr->width), iVar1 == 0)) &&
           (iVar1 = overflow2(ptr->width << 2,ptr->height), iVar1 == 0)) {
          piVar3 = (int *)gdMalloc((long)ptr->height * (long)ptr->width * 4);
          ptr->bitmap = piVar3;
          if (piVar3 != (int *)0x0) {
            iVar1 = ptr->height;
            if (0 < iVar1) {
              iVar4 = ptr->width;
              iVar7 = 0;
              iVar5 = 0;
              do {
                if (0 < iVar4) {
                  iVar1 = 0;
                  do {
                    uVar6 = (*getin)(in);
                    uVar2 = 7;
                    iVar4 = iVar1;
                    do {
                      if (iVar4 < ptr->width) {
                        ptr->bitmap[iVar7] = (uint)((uVar6 >> (uVar2 & 0x1f) & 1) != 0);
                        iVar7 = iVar7 + 1;
                      }
                      iVar4 = iVar4 + 1;
                      bVar8 = uVar2 != 0;
                      uVar2 = uVar2 - 1;
                    } while (bVar8);
                    iVar1 = iVar1 + 8;
                    iVar4 = ptr->width;
                  } while (iVar1 < iVar4);
                  iVar1 = ptr->height;
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 < iVar1);
            }
            *return_wbmp = ptr;
            return 0;
          }
        }
      }
    }
LAB_00123a95:
    gdFree(ptr);
  }
  return -1;
}

Assistant:

int readwbmp(int (*getin) (void *in), void *in, Wbmp **return_wbmp)
{
	int row, col, byte, pel, pos;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof(Wbmp))) == NULL) {
		return -1;
	}

	wbmp->type = getin(in);
	if(wbmp->type != 0) {
		gdFree(wbmp);
		return -1;
	}

	if(skipheader(getin, in)) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->width = getmbi(getin, in);
	if(wbmp->width == -1) {
		gdFree(wbmp);
		return -1;
	}

	wbmp->height = getmbi(getin, in);
	if(wbmp->height == -1) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("W: %d, H: %d\n", wbmp->width, wbmp->height);
#endif

	if(	overflow2(sizeof(int), wbmp->width) ||
		overflow2(sizeof(int) * wbmp->width, wbmp->height)) {
		gdFree(wbmp);
		return -1;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * wbmp->width * wbmp->height)) == NULL) {
		gdFree(wbmp);
		return -1;
	}

#ifdef __DEBUG
	printf("DATA CONSTRUCTED\n");
#endif

	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width;) {
			byte = getin(in);

			for(pel = 7; pel >= 0; pel--) {
				if(col++ < wbmp->width) {
					if(byte & 1 << pel) {
						wbmp->bitmap[pos] = WBMP_WHITE;
					} else {
						wbmp->bitmap[pos] = WBMP_BLACK;
					}
					pos++;
				}
			}
		}
	}

	*return_wbmp = wbmp;

	return 0;
}